

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CS248::Face::getAxes(Face *this,vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *axes)

{
  reference pvVar1;
  Size SVar2;
  pointer pVVar3;
  reference v;
  vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *in_RSI;
  Vector3D *in_RDI;
  Vector3D p1_1;
  Vector3D p0_1;
  HalfedgeCIter h_1;
  Vector3D p3;
  Vector3D p2;
  Vector3D p1;
  Vector3D p0;
  HalfedgeCIter h;
  Face *in_stack_fffffffffffffe38;
  Vector3D *in_stack_fffffffffffffe40;
  Face *in_stack_fffffffffffffe50;
  double in_stack_fffffffffffffe58;
  vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *in_stack_fffffffffffffe60;
  Vector3D local_190;
  double local_178;
  double local_170;
  double local_168;
  _List_node_base *local_160;
  Vector3D local_158;
  _List_node_base *local_140;
  _List_node_base *local_138;
  Face *in_stack_fffffffffffffed8;
  double local_e0;
  double local_d8;
  double local_d0;
  Vector3D local_c0;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  Vector3D local_98;
  _List_node_base *local_80;
  _List_node_base *local_78;
  Vector3D local_70;
  _List_node_base *local_58;
  _List_node_base *local_50;
  Vector3D local_48;
  _List_node_base *local_30;
  double local_28;
  double local_20;
  double local_18;
  vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::resize
            (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  normal(in_stack_fffffffffffffed8);
  pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,2);
  pvVar1->x = local_28;
  pvVar1->y = local_20;
  pvVar1->z = local_18;
  SVar2 = degree(in_stack_fffffffffffffe50);
  if (SVar2 == 4) {
    local_30 = (_List_node_base *)halfedge(in_stack_fffffffffffffe38);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_50 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D(&local_48,&pVVar3->position);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_58 = (_List_node_base *)Halfedge::next((Halfedge *)in_stack_fffffffffffffe38);
    local_30 = local_58;
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_78 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D(&local_70,&pVVar3->position);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_80 = (_List_node_base *)Halfedge::next((Halfedge *)in_stack_fffffffffffffe38);
    local_30 = local_80;
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_a0 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D(&local_98,&pVVar3->position);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_a8 = (_List_node_base *)Halfedge::next((Halfedge *)in_stack_fffffffffffffe38);
    local_30 = local_a8;
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D(&local_c0,&pVVar3->position);
    Vector3D::operator-(in_RDI,in_stack_fffffffffffffe40);
    Vector3D::operator-(in_RDI,in_stack_fffffffffffffe40);
    Vector3D::operator+(in_RDI,in_stack_fffffffffffffe40);
    pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
    pvVar1->x = local_e0;
    pvVar1->y = local_d8;
    pvVar1->z = local_d0;
  }
  else {
    halfedge(in_stack_fffffffffffffe38);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_138 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffed0,&pVVar3->position);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_140 = (_List_node_base *)Halfedge::next((Halfedge *)in_stack_fffffffffffffe38);
    std::_List_const_iterator<CS248::Halfedge>::operator->
              ((_List_const_iterator<CS248::Halfedge> *)in_stack_fffffffffffffe40);
    local_160 = (_List_node_base *)Halfedge::vertex((Halfedge *)in_stack_fffffffffffffe38);
    pVVar3 = std::_List_const_iterator<CS248::Vertex>::operator->
                       ((_List_const_iterator<CS248::Vertex> *)in_stack_fffffffffffffe40);
    Vector3D::Vector3D(&local_158,&pVVar3->position);
    Vector3D::operator-(in_RDI,in_stack_fffffffffffffe40);
    pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
    pvVar1->x = local_178;
    pvVar1->y = local_170;
    pvVar1->z = local_168;
  }
  pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
  v = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,2);
  dot(pvVar1,v);
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,2);
  CS248::operator*(&in_RDI->x,in_stack_fffffffffffffe40);
  pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
  Vector3D::operator-=(pvVar1,&local_190);
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
  Vector3D::normalize(in_stack_fffffffffffffe40);
  pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,2);
  std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,0);
  cross(in_RDI,pvVar1);
  pvVar1 = std::vector<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>::operator[](local_10,1);
  pvVar1->x = (double)in_stack_fffffffffffffe50;
  pvVar1->y = in_stack_fffffffffffffe58;
  pvVar1->z = (double)in_stack_fffffffffffffe60;
  return;
}

Assistant:

void Face::getAxes(vector<Vector3D>& axes) const {
  axes.resize(3);

  // Set the Z direction to the face normal
  axes[2] = normal();

  if (degree() == 4) {
    // For quads, we'll try to roughly align the X direction
    // with one of the principal axes of the quad.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;
    h = h->next();
    Vector3D p2 = h->vertex()->position;
    h = h->next();
    Vector3D p3 = h->vertex()->position;

    axes[0] = (p1 - p0) + (p2 - p3);
  } else {
    // Otherwise, we'll just use an arbitrary edge
    // to determine the direction of the X-axis.
    HalfedgeCIter h = halfedge();
    Vector3D p0 = h->vertex()->position;
    h = h->next();
    Vector3D p1 = h->vertex()->position;

    axes[0] = p1 - p0;
  }

  // Make X orthonormal to Z
  axes[0] -= dot(axes[0], axes[2]) * axes[2];
  axes[0].normalize();

  // Choose the Y direction so that X x Y = Z
  axes[1] = cross(axes[2], axes[0]);
}